

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFontAtlas::RenderCustomTexData(ImFontAtlas *this,int pass,void *p_rects)

{
  int *piVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  char cVar5;
  long lVar6;
  undefined8 uVar7;
  void *__dest;
  ImGuiContext *pIVar8;
  int y;
  int iVar9;
  int iVar10;
  undefined8 *puVar11;
  int iVar12;
  long lVar13;
  void *pvVar14;
  float fVar15;
  long lVar16;
  long lVar17;
  float fVar18;
  float fVar20;
  undefined1 auVar19 [16];
  ImVec2 IVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  pIVar8 = GImGui;
  if (pass == 1) {
    if (0 < *p_rects) {
      lVar6 = *(long *)((long)p_rects + 8);
      iVar10 = 0;
      lVar13 = 0;
      do {
        lVar16 = 0;
        do {
          cVar5 = "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...XXX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..XX.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.XX..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XXX...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           X.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            X..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       ------------------------------------X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           XX    X..X  -       - X.....X -        X.....X        -   X.X           X.X   -                 X..X          -  X...X  -         X...X         -  X..X           X..X  -                  XX           -   X.X   -          X.X          - X...XXXXXXXXXXXXX...X -           ------------        -    X    -           X           -X..............." /* TRUNCATED STRING LITERAL */
                  [(int)lVar13 + lVar16];
          lVar17 = (long)(int)((uint)*(ushort *)(lVar6 + 8) + (int)lVar16 +
                              ((uint)*(ushort *)(lVar6 + 10) + iVar10) * this->TexWidth);
          this->TexPixelsAlpha8[lVar17] = -(cVar5 == '.');
          this->TexPixelsAlpha8[lVar17 + 0x5b] = -(cVar5 == 'X');
          lVar16 = lVar16 + 1;
        } while ((int)lVar16 != 0x5a);
        iVar10 = iVar10 + 1;
        lVar13 = (int)lVar13 + lVar16;
      } while (iVar10 != 0x1b);
      uVar3 = this->TexWidth;
      uVar4 = this->TexHeight;
      auVar19._4_2_ = SUB42((float)(int)uVar4,0);
      auVar19._0_4_ = (float)(int)uVar3;
      auVar19._6_2_ = (short)((uint)(float)(int)uVar4 >> 0x10);
      auVar19._8_8_ = 0;
      auVar19 = divps(_DAT_0018e4d0,auVar19);
      fVar18 = auVar19._0_4_;
      IVar21.x = ((float)(*(uint *)(lVar6 + 8) & 0xffff) + 0.5) * fVar18;
      fVar20 = auVar19._4_4_;
      IVar21.y = ((float)(*(uint *)(lVar6 + 8) >> 0x10) + 0.5) * fVar20;
      this->TexUvWhitePixel = IVar21;
      puVar11 = &local_b8;
      local_b8 = 0;
      uStack_b0 = 0x41500000;
      local_a8 = 0x4180000040e00000;
      uStack_a0 = 0x4100000040800000;
      local_98 = 0x41f80000;
      uStack_90 = 0x41b8000041b80000;
      local_88 = 0x4130000041300000;
      uStack_80 = 0x41a80000;
      local_78 = 0x41b8000041100000;
      uStack_70 = 0x4130000040a00000;
      local_68 = 0x41900000425c0000;
      uStack_60 = 0x4110000041b80000;
      local_58 = 0x40a0000041300000;
      uStack_50 = 0x42920000;
      local_48 = 0x4188000041880000;
      uStack_40 = 0x4110000041100000;
      local_38 = 0x425c0000;
      uStack_30 = 0x4188000041880000;
      local_28 = 0x4110000041100000;
      lVar13 = 0x1984;
      lVar16 = 0;
      do {
        pIVar8 = GImGui;
        *(int *)((long)(GImGui->IO).KeyMap + lVar13 + -0x34) = (int)lVar16;
        fVar22 = (float)puVar11[-2] + (float)(*(uint *)(lVar6 + 8) & 0xffff);
        fVar23 = (float)((ulong)puVar11[-2] >> 0x20) + (float)(*(uint *)(lVar6 + 8) >> 0x10);
        *(undefined8 *)((long)(pIVar8->IO).KeyMap + lVar13 + -0x30) = *puVar11;
        fVar24 = fVar20 * fVar23;
        *(ulong *)((long)(pIVar8->IO).KeyMap + lVar13 + -0x20) = CONCAT44(fVar24,fVar18 * fVar22);
        uVar7 = puVar11[-1];
        fVar15 = (float)uVar7;
        *(float *)((long)(pIVar8->IO).KeyMap + lVar13 + -0x28) = fVar15;
        fVar25 = (float)((ulong)uVar7 >> 0x20);
        *(float *)((long)(pIVar8->IO).KeyMap + lVar13 + -0x24) = fVar25;
        fVar25 = (fVar23 + fVar25) * fVar20;
        pfVar2 = (float *)((long)(pIVar8->IO).KeyMap + lVar13 + -0x18);
        *pfVar2 = fVar18 * (fVar22 + 91.0);
        pfVar2[1] = fVar24;
        pfVar2[2] = (fVar22 + fVar15) * fVar18;
        pfVar2[3] = fVar25;
        *(ulong *)((long)(pIVar8->IO).KeyMap + lVar13 + -8) =
             CONCAT44(fVar25,(fVar22 + 91.0 + fVar15) * fVar18);
        lVar16 = lVar16 + 1;
        puVar11 = puVar11 + 3;
        lVar13 = lVar13 + 0x34;
      } while (lVar16 != 7);
      return;
    }
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                  ,0x353,"value_type &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]");
  }
  if (pass != 0) {
    return;
  }
  iVar10 = *p_rects;
  if (iVar10 != *(int *)((long)p_rects + 4)) {
    __dest = *(void **)((long)p_rects + 8);
    goto LAB_001536c7;
  }
  if (iVar10 == 0) {
    iVar9 = 8;
  }
  else {
    iVar9 = iVar10 / 2 + iVar10;
  }
  iVar12 = iVar10 + 1;
  if (iVar10 + 1 < iVar9) {
    iVar12 = iVar9;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (*(pIVar8->IO).MemAllocFn)((long)iVar12 << 4);
  if (*(void **)((long)p_rects + 8) == (void *)0x0) {
LAB_001536b6:
    pvVar14 = (void *)0x0;
    pIVar8 = GImGui;
  }
  else {
    memcpy(__dest,*(void **)((long)p_rects + 8),(long)*p_rects << 4);
    pIVar8 = GImGui;
    pvVar14 = *(void **)((long)p_rects + 8);
    if (pvVar14 == (void *)0x0) goto LAB_001536b6;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar8->IO).MemFreeFn)(pvVar14);
  *(void **)((long)p_rects + 8) = __dest;
  *(int *)((long)p_rects + 4) = iVar12;
  iVar10 = *p_rects;
LAB_001536c7:
  *(int *)p_rects = iVar10 + 1;
  *(undefined8 *)((long)__dest + (long)iVar10 * 0x10) = 0x1c00b500000000;
  *(undefined8 *)((long)__dest + (long)iVar10 * 0x10 + 8) = 0;
  return;
}

Assistant:

void ImFontAtlas::RenderCustomTexData(int pass, void* p_rects)
{
    // A work of art lies ahead! (. = white layer, X = black layer, others are blank)
    // The white texels on the top left are the ones we'll use everywhere in ImGui to render filled shapes.
    const int TEX_DATA_W = 90;
    const int TEX_DATA_H = 27;
    const char texture_data[TEX_DATA_W*TEX_DATA_H+1] =
    {
        "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX"
        "..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X"
        "---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X"
        "X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X"
        "XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X"
        "X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X"
        "X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX"
        "X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      "
        "X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       "
        "X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        "
        "X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         "
        "X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          "
        "X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           "
        "X.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            "
        "X..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           "
        "X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          "
        "X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          "
        "X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       ------------------------------------"
        "X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           "
        "XX    X..X  -       - X.....X -        X.....X        -   X.X           X.X   -           "
        "      X..X          -  X...X  -         X...X         -  X..X           X..X  -           "
        "       XX           -   X.X   -          X.X          - X...XXXXXXXXXXXXX...X -           "
        "------------        -    X    -           X           -X.....................X-           "
        "                    ----------------------------------- X...XXXXXXXXXXXXX...X -           "
        "                                                      -  X..X           X..X  -           "
        "                                                      -   X.X           X.X   -           "
        "                                                      -    XX           XX    -           "
    };

    ImVector<stbrp_rect>& rects = *(ImVector<stbrp_rect>*)p_rects;
    if (pass == 0)
    {
        // Request rectangles
        stbrp_rect r;
        memset(&r, 0, sizeof(r));
        r.w = (TEX_DATA_W*2)+1;
        r.h = TEX_DATA_H+1;
        rects.push_back(r);
    }
    else if (pass == 1)
    {
        // Render/copy pixels
        const stbrp_rect& r = rects[0];
        for (int y = 0, n = 0; y < TEX_DATA_H; y++)
            for (int x = 0; x < TEX_DATA_W; x++, n++)
            {
                const int offset0 = (int)(r.x + x) + (int)(r.y + y) * TexWidth;
                const int offset1 = offset0 + 1 + TEX_DATA_W;
                TexPixelsAlpha8[offset0] = texture_data[n] == '.' ? 0xFF : 0x00;
                TexPixelsAlpha8[offset1] = texture_data[n] == 'X' ? 0xFF : 0x00;
            }
        const ImVec2 tex_uv_scale(1.0f / TexWidth, 1.0f / TexHeight);
        TexUvWhitePixel = ImVec2((r.x + 0.5f) * tex_uv_scale.x, (r.y + 0.5f) * tex_uv_scale.y);

        // Setup mouse cursors
        const ImVec2 cursor_datas[ImGuiMouseCursor_Count_][3] =
        {
            // Pos ........ Size ......... Offset ......
            { ImVec2(0,3),  ImVec2(12,19), ImVec2( 0, 0) }, // ImGuiMouseCursor_Arrow
            { ImVec2(13,0), ImVec2(7,16),  ImVec2( 4, 8) }, // ImGuiMouseCursor_TextInput
            { ImVec2(31,0), ImVec2(23,23), ImVec2(11,11) }, // ImGuiMouseCursor_Move
            { ImVec2(21,0), ImVec2( 9,23), ImVec2( 5,11) }, // ImGuiMouseCursor_ResizeNS
            { ImVec2(55,18),ImVec2(23, 9), ImVec2(11, 5) }, // ImGuiMouseCursor_ResizeEW
            { ImVec2(73,0), ImVec2(17,17), ImVec2( 9, 9) }, // ImGuiMouseCursor_ResizeNESW
            { ImVec2(55,0), ImVec2(17,17), ImVec2( 9, 9) }, // ImGuiMouseCursor_ResizeNWSE
        };

        for (int type = 0; type < ImGuiMouseCursor_Count_; type++)
        {
            ImGuiMouseCursorData& cursor_data = GImGui->MouseCursorData[type];
            ImVec2 pos = cursor_datas[type][0] + ImVec2((float)r.x, (float)r.y);
            const ImVec2 size = cursor_datas[type][1];
            cursor_data.Type = type;
            cursor_data.Size = size;
            cursor_data.HotOffset = cursor_datas[type][2];
            cursor_data.TexUvMin[0] = (pos) * tex_uv_scale;
            cursor_data.TexUvMax[0] = (pos + size) * tex_uv_scale;
            pos.x += TEX_DATA_W+1;
            cursor_data.TexUvMin[1] = (pos) * tex_uv_scale;
            cursor_data.TexUvMax[1] = (pos + size) * tex_uv_scale;
        }
    }
}